

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSystemDescriptor.cpp
# Opt level: O1

void __thiscall
chrono::ChSystemDescriptor::WriteMatrixBlocks(ChSystemDescriptor *this,string *path,string *prefix)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  undefined1 *puVar3;
  pointer pcVar4;
  double *pdVar5;
  Index IVar6;
  long *plVar7;
  _func_int **pp_Var8;
  size_type *psVar9;
  long lVar10;
  string filename;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_4;
  ChVectorDynamic<double> mdfric;
  ChVectorDynamic<double> mdb;
  ChVectorDynamic<double> mdf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_5;
  ChSparseMatrix mdE;
  ChSparseMatrix mdCq;
  ChSparseMatrix mdM;
  ChStreamOutAsciiFile file_fric;
  ChStreamOutAsciiFile file_b;
  ChStreamOutAsciiFile file_f;
  ChStreamOutAsciiFile file_E;
  ChStreamOutAsciiFile file_Cq;
  ChStreamOutAsciiFile file_M;
  
  filename._M_dataplus._M_p = (pointer)&filename.field_2;
  filename._M_string_length = 0;
  filename.field_2._M_local_buf[0] = '\0';
  mdM.super_SparseCompressedBase<Eigen::SparseMatrix<double,_1,_int>_>.
  super_SparseMatrixBase<Eigen::SparseMatrix<double,_1,_int>_>.m_isRValue =
       (SparseMatrixBase<Eigen::SparseMatrix<double,_1,_int>_>)false;
  mdM._vptr_SparseMatrix = (_func_int **)&PTR_SetElement_00b34038;
  mdM.m_outerSize = -1;
  mdM.m_innerSize = 0;
  mdM.m_outerIndex = (StorageIndex *)0x0;
  mdM.m_innerNonZeros = (StorageIndex *)0x0;
  mdM.m_data.m_values = (Scalar *)0x0;
  mdM.m_data.m_indices = (StorageIndex *)0x0;
  mdM.m_data.m_size = 0;
  mdM.m_data.m_allocatedSize = 0;
  Eigen::SparseMatrix<double,_1,_int>::resize(&mdM,0,0);
  mdCq.super_SparseCompressedBase<Eigen::SparseMatrix<double,_1,_int>_>.
  super_SparseMatrixBase<Eigen::SparseMatrix<double,_1,_int>_>.m_isRValue =
       (SparseMatrixBase<Eigen::SparseMatrix<double,_1,_int>_>)false;
  mdCq._vptr_SparseMatrix = (_func_int **)&PTR_SetElement_00b34038;
  mdCq.m_outerSize = -1;
  mdCq.m_innerSize = 0;
  mdCq.m_outerIndex = (StorageIndex *)0x0;
  mdCq.m_innerNonZeros = (StorageIndex *)0x0;
  mdCq.m_data.m_values = (Scalar *)0x0;
  mdCq.m_data.m_indices = (StorageIndex *)0x0;
  mdCq.m_data.m_size = 0;
  mdCq.m_data.m_allocatedSize = 0;
  Eigen::SparseMatrix<double,_1,_int>::resize(&mdCq,0,0);
  mdE.super_SparseCompressedBase<Eigen::SparseMatrix<double,_1,_int>_>.
  super_SparseMatrixBase<Eigen::SparseMatrix<double,_1,_int>_>.m_isRValue =
       (SparseMatrixBase<Eigen::SparseMatrix<double,_1,_int>_>)false;
  mdE._vptr_SparseMatrix = (_func_int **)&PTR_SetElement_00b34038;
  mdE.m_outerSize = -1;
  mdE.m_innerSize = 0;
  mdE.m_outerIndex = (StorageIndex *)0x0;
  mdE.m_innerNonZeros = (StorageIndex *)0x0;
  mdE.m_data.m_values = (Scalar *)0x0;
  mdE.m_data.m_indices = (StorageIndex *)0x0;
  mdE.m_data.m_size = 0;
  mdE.m_data.m_allocatedSize = 0;
  Eigen::SparseMatrix<double,_1,_int>::resize(&mdE,0,0);
  mdf.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  mdf.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  mdb.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  mdb.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  mdfric.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  mdfric.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  (*this->_vptr_ChSystemDescriptor[0x1b])(this,&mdCq,&mdM,&mdE,&mdf,&mdb,&mdfric,0,0);
  puVar1 = &file_E.super_ChStreamFile.field_0x10;
  pcVar4 = (path->_M_dataplus)._M_p;
  file_E.super_ChStreamFile._vptr_ChStreamFile = (_func_int **)puVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&file_E,pcVar4,pcVar4 + path->_M_string_length);
  std::__cxx11::string::append((char *)&file_E);
  plVar7 = (long *)std::__cxx11::string::_M_append
                             ((char *)&file_E,(ulong)(prefix->_M_dataplus)._M_p);
  puVar2 = &file_Cq.super_ChStreamFile.field_0x10;
  pp_Var8 = (_func_int **)(plVar7 + 2);
  if ((_func_int **)*plVar7 == pp_Var8) {
    file_Cq.super_ChStreamFile._16_8_ = *pp_Var8;
    file_Cq.super_ChStreamFile._24_8_ = plVar7[3];
    file_Cq.super_ChStreamFile._vptr_ChStreamFile = (_func_int **)puVar2;
  }
  else {
    file_Cq.super_ChStreamFile._16_8_ = *pp_Var8;
    file_Cq.super_ChStreamFile._vptr_ChStreamFile = (_func_int **)*plVar7;
  }
  file_Cq.super_ChStreamFile._8_8_ = plVar7[1];
  *plVar7 = (long)pp_Var8;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&file_Cq);
  puVar3 = &file_M.super_ChStreamFile.field_0x10;
  pp_Var8 = (_func_int **)(plVar7 + 2);
  if ((_func_int **)*plVar7 == pp_Var8) {
    file_M.super_ChStreamFile._16_8_ = *pp_Var8;
    file_M.super_ChStreamFile._24_8_ = plVar7[3];
    file_M.super_ChStreamFile._vptr_ChStreamFile = (_func_int **)puVar3;
  }
  else {
    file_M.super_ChStreamFile._16_8_ = *pp_Var8;
    file_M.super_ChStreamFile._vptr_ChStreamFile = (_func_int **)*plVar7;
  }
  file_M.super_ChStreamFile._8_8_ = plVar7[1];
  *plVar7 = (long)pp_Var8;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  std::__cxx11::string::operator=((string *)&filename,(string *)&file_M);
  if (file_M.super_ChStreamFile._vptr_ChStreamFile != (_func_int **)puVar3) {
    operator_delete(file_M.super_ChStreamFile._vptr_ChStreamFile,
                    file_M.super_ChStreamFile._16_8_ + 1);
  }
  if (file_Cq.super_ChStreamFile._vptr_ChStreamFile != (_func_int **)puVar2) {
    operator_delete(file_Cq.super_ChStreamFile._vptr_ChStreamFile,
                    file_Cq.super_ChStreamFile._16_8_ + 1);
  }
  if (file_E.super_ChStreamFile._vptr_ChStreamFile != (_func_int **)puVar1) {
    operator_delete(file_E.super_ChStreamFile._vptr_ChStreamFile,
                    file_E.super_ChStreamFile._16_8_ + 1);
  }
  ChStreamOutAsciiFile::ChStreamOutAsciiFile(&file_M,filename._M_dataplus._M_p,_S_trunc);
  builtin_strncpy(file_M.super_ChStreamOutAscii.number_format,"%.12g",6);
  StreamOUTsparseMatlabFormat(&mdM,&file_M.super_ChStreamOutAscii);
  puVar3 = &file_f.super_ChStreamFile.field_0x10;
  pcVar4 = (path->_M_dataplus)._M_p;
  file_f.super_ChStreamFile._vptr_ChStreamFile = (_func_int **)puVar3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&file_f,pcVar4,pcVar4 + path->_M_string_length);
  std::__cxx11::string::append((char *)&file_f);
  plVar7 = (long *)std::__cxx11::string::_M_append
                             ((char *)&file_f,(ulong)(prefix->_M_dataplus)._M_p);
  pp_Var8 = (_func_int **)(plVar7 + 2);
  if ((_func_int **)*plVar7 == pp_Var8) {
    file_E.super_ChStreamFile._16_8_ = *pp_Var8;
    file_E.super_ChStreamFile._24_8_ = plVar7[3];
    file_E.super_ChStreamFile._vptr_ChStreamFile = (_func_int **)puVar1;
  }
  else {
    file_E.super_ChStreamFile._16_8_ = *pp_Var8;
    file_E.super_ChStreamFile._vptr_ChStreamFile = (_func_int **)*plVar7;
  }
  file_E.super_ChStreamFile._8_8_ = plVar7[1];
  *plVar7 = (long)pp_Var8;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&file_E);
  pp_Var8 = (_func_int **)(plVar7 + 2);
  if ((_func_int **)*plVar7 == pp_Var8) {
    file_Cq.super_ChStreamFile._16_8_ = *pp_Var8;
    file_Cq.super_ChStreamFile._24_8_ = plVar7[3];
    file_Cq.super_ChStreamFile._vptr_ChStreamFile = (_func_int **)puVar2;
  }
  else {
    file_Cq.super_ChStreamFile._16_8_ = *pp_Var8;
    file_Cq.super_ChStreamFile._vptr_ChStreamFile = (_func_int **)*plVar7;
  }
  file_Cq.super_ChStreamFile._8_8_ = plVar7[1];
  *plVar7 = (long)pp_Var8;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  std::__cxx11::string::operator=((string *)&filename,(string *)&file_Cq);
  if (file_Cq.super_ChStreamFile._vptr_ChStreamFile != (_func_int **)puVar2) {
    operator_delete(file_Cq.super_ChStreamFile._vptr_ChStreamFile,
                    file_Cq.super_ChStreamFile._16_8_ + 1);
  }
  if (file_E.super_ChStreamFile._vptr_ChStreamFile != (_func_int **)puVar1) {
    operator_delete(file_E.super_ChStreamFile._vptr_ChStreamFile,
                    file_E.super_ChStreamFile._16_8_ + 1);
  }
  if (file_f.super_ChStreamFile._vptr_ChStreamFile != (_func_int **)puVar3) {
    operator_delete(file_f.super_ChStreamFile._vptr_ChStreamFile,
                    file_f.super_ChStreamFile._16_8_ + 1);
  }
  ChStreamOutAsciiFile::ChStreamOutAsciiFile(&file_Cq,filename._M_dataplus._M_p,_S_trunc);
  builtin_strncpy(file_Cq.super_ChStreamOutAscii.number_format,"%.12g",6);
  StreamOUTsparseMatlabFormat(&mdCq,&file_Cq.super_ChStreamOutAscii);
  puVar2 = &file_b.super_ChStreamFile.field_0x10;
  pcVar4 = (path->_M_dataplus)._M_p;
  file_b.super_ChStreamFile._vptr_ChStreamFile = (_func_int **)puVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&file_b,pcVar4,pcVar4 + path->_M_string_length);
  std::__cxx11::string::append((char *)&file_b);
  plVar7 = (long *)std::__cxx11::string::_M_append
                             ((char *)&file_b,(ulong)(prefix->_M_dataplus)._M_p);
  pp_Var8 = (_func_int **)(plVar7 + 2);
  if ((_func_int **)*plVar7 == pp_Var8) {
    file_f.super_ChStreamFile._16_8_ = *pp_Var8;
    file_f.super_ChStreamFile._24_8_ = plVar7[3];
    file_f.super_ChStreamFile._vptr_ChStreamFile = (_func_int **)puVar3;
  }
  else {
    file_f.super_ChStreamFile._16_8_ = *pp_Var8;
    file_f.super_ChStreamFile._vptr_ChStreamFile = (_func_int **)*plVar7;
  }
  file_f.super_ChStreamFile._8_8_ = plVar7[1];
  *plVar7 = (long)pp_Var8;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&file_f);
  pp_Var8 = (_func_int **)(plVar7 + 2);
  if ((_func_int **)*plVar7 == pp_Var8) {
    file_E.super_ChStreamFile._16_8_ = *pp_Var8;
    file_E.super_ChStreamFile._24_8_ = plVar7[3];
    file_E.super_ChStreamFile._vptr_ChStreamFile = (_func_int **)puVar1;
  }
  else {
    file_E.super_ChStreamFile._16_8_ = *pp_Var8;
    file_E.super_ChStreamFile._vptr_ChStreamFile = (_func_int **)*plVar7;
  }
  file_E.super_ChStreamFile._8_8_ = plVar7[1];
  *plVar7 = (long)pp_Var8;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  std::__cxx11::string::operator=((string *)&filename,(string *)&file_E);
  if (file_E.super_ChStreamFile._vptr_ChStreamFile != (_func_int **)puVar1) {
    operator_delete(file_E.super_ChStreamFile._vptr_ChStreamFile,
                    file_E.super_ChStreamFile._16_8_ + 1);
  }
  if (file_f.super_ChStreamFile._vptr_ChStreamFile != (_func_int **)puVar3) {
    operator_delete(file_f.super_ChStreamFile._vptr_ChStreamFile,
                    file_f.super_ChStreamFile._16_8_ + 1);
  }
  if (file_b.super_ChStreamFile._vptr_ChStreamFile != (_func_int **)puVar2) {
    operator_delete(file_b.super_ChStreamFile._vptr_ChStreamFile,
                    file_b.super_ChStreamFile._16_8_ + 1);
  }
  ChStreamOutAsciiFile::ChStreamOutAsciiFile(&file_E,filename._M_dataplus._M_p,_S_trunc);
  builtin_strncpy(file_E.super_ChStreamOutAscii.number_format,"%.12g",6);
  StreamOUTsparseMatlabFormat(&mdE,&file_E.super_ChStreamOutAscii);
  puVar1 = &file_fric.super_ChStreamFile.field_0x10;
  pcVar4 = (path->_M_dataplus)._M_p;
  file_fric.super_ChStreamFile._vptr_ChStreamFile = (_func_int **)puVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&file_fric,pcVar4,pcVar4 + path->_M_string_length);
  std::__cxx11::string::append((char *)&file_fric);
  plVar7 = (long *)std::__cxx11::string::_M_append
                             ((char *)&file_fric,(ulong)(prefix->_M_dataplus)._M_p);
  pp_Var8 = (_func_int **)(plVar7 + 2);
  if ((_func_int **)*plVar7 == pp_Var8) {
    file_b.super_ChStreamFile._16_8_ = *pp_Var8;
    file_b.super_ChStreamFile._24_8_ = plVar7[3];
    file_b.super_ChStreamFile._vptr_ChStreamFile = (_func_int **)puVar2;
  }
  else {
    file_b.super_ChStreamFile._16_8_ = *pp_Var8;
    file_b.super_ChStreamFile._vptr_ChStreamFile = (_func_int **)*plVar7;
  }
  file_b.super_ChStreamFile._8_8_ = plVar7[1];
  *plVar7 = (long)pp_Var8;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&file_b);
  pp_Var8 = (_func_int **)(plVar7 + 2);
  if ((_func_int **)*plVar7 == pp_Var8) {
    file_f.super_ChStreamFile._16_8_ = *pp_Var8;
    file_f.super_ChStreamFile._24_8_ = plVar7[3];
    file_f.super_ChStreamFile._vptr_ChStreamFile = (_func_int **)puVar3;
  }
  else {
    file_f.super_ChStreamFile._16_8_ = *pp_Var8;
    file_f.super_ChStreamFile._vptr_ChStreamFile = (_func_int **)*plVar7;
  }
  file_f.super_ChStreamFile._8_8_ = plVar7[1];
  *plVar7 = (long)pp_Var8;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  std::__cxx11::string::operator=((string *)&filename,(string *)&file_f);
  if (file_f.super_ChStreamFile._vptr_ChStreamFile != (_func_int **)puVar3) {
    operator_delete(file_f.super_ChStreamFile._vptr_ChStreamFile,
                    file_f.super_ChStreamFile._16_8_ + 1);
  }
  if (file_b.super_ChStreamFile._vptr_ChStreamFile != (_func_int **)puVar2) {
    operator_delete(file_b.super_ChStreamFile._vptr_ChStreamFile,
                    file_b.super_ChStreamFile._16_8_ + 1);
  }
  if (file_fric.super_ChStreamFile._vptr_ChStreamFile != (_func_int **)puVar1) {
    operator_delete(file_fric.super_ChStreamFile._vptr_ChStreamFile,
                    file_fric.super_ChStreamFile._16_8_ + 1);
  }
  ChStreamOutAsciiFile::ChStreamOutAsciiFile(&file_f,filename._M_dataplus._M_p,_S_trunc);
  IVar6 = mdf.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  pdVar5 = mdf.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
  builtin_strncpy(file_f.super_ChStreamOutAscii.number_format,"%.12g",6);
  if (-1 < mdf.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows ||
      mdf.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data ==
      (double *)0x0) {
    if (0 < mdf.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
      lVar10 = 0;
      do {
        if (IVar6 <= lVar10) goto LAB_007b1b76;
        ChStreamOutAscii::operator<<(&file_f.super_ChStreamOutAscii,pdVar5[lVar10]);
        ChStreamOutAscii::operator<<(&file_f.super_ChStreamOutAscii,"\n");
        lVar10 = lVar10 + 1;
      } while (IVar6 != lVar10);
    }
    pcVar4 = (path->_M_dataplus)._M_p;
    __str_4._M_dataplus._M_p = (pointer)&__str_4.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__str_4,pcVar4,pcVar4 + path->_M_string_length);
    std::__cxx11::string::append((char *)&__str_4);
    puVar1 = &file_fric.super_ChStreamFile.field_0x10;
    puVar2 = &file_b.super_ChStreamFile.field_0x10;
    plVar7 = (long *)std::__cxx11::string::_M_append
                               ((char *)&__str_4,(ulong)(prefix->_M_dataplus)._M_p);
    pp_Var8 = (_func_int **)(plVar7 + 2);
    if ((_func_int **)*plVar7 == pp_Var8) {
      file_fric.super_ChStreamFile._16_8_ = *pp_Var8;
      file_fric.super_ChStreamFile._24_8_ = plVar7[3];
      file_fric.super_ChStreamFile._vptr_ChStreamFile = (_func_int **)puVar1;
    }
    else {
      file_fric.super_ChStreamFile._16_8_ = *pp_Var8;
      file_fric.super_ChStreamFile._vptr_ChStreamFile = (_func_int **)*plVar7;
    }
    file_fric.super_ChStreamFile._8_8_ = plVar7[1];
    *plVar7 = (long)pp_Var8;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&file_fric);
    pp_Var8 = (_func_int **)(plVar7 + 2);
    if ((_func_int **)*plVar7 == pp_Var8) {
      file_b.super_ChStreamFile._16_8_ = *pp_Var8;
      file_b.super_ChStreamFile._24_8_ = plVar7[3];
      file_b.super_ChStreamFile._vptr_ChStreamFile = (_func_int **)puVar2;
    }
    else {
      file_b.super_ChStreamFile._16_8_ = *pp_Var8;
      file_b.super_ChStreamFile._vptr_ChStreamFile = (_func_int **)*plVar7;
    }
    file_b.super_ChStreamFile._8_8_ = plVar7[1];
    *plVar7 = (long)pp_Var8;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    std::__cxx11::string::operator=((string *)&filename,(string *)&file_b);
    if (file_b.super_ChStreamFile._vptr_ChStreamFile != (_func_int **)puVar2) {
      operator_delete(file_b.super_ChStreamFile._vptr_ChStreamFile,
                      file_b.super_ChStreamFile._16_8_ + 1);
    }
    if (file_fric.super_ChStreamFile._vptr_ChStreamFile != (_func_int **)puVar1) {
      operator_delete(file_fric.super_ChStreamFile._vptr_ChStreamFile,
                      file_fric.super_ChStreamFile._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str_4._M_dataplus._M_p != &__str_4.field_2) {
      operator_delete(__str_4._M_dataplus._M_p,__str_4.field_2._M_allocated_capacity + 1);
    }
    ChStreamOutAsciiFile::ChStreamOutAsciiFile(&file_b,filename._M_dataplus._M_p,_S_trunc);
    IVar6 = mdb.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
    pdVar5 = mdb.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
    builtin_strncpy(file_b.super_ChStreamOutAscii.number_format,"%.12g",6);
    if (-1 < mdb.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows ||
        mdb.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data ==
        (double *)0x0) {
      if (0 < mdb.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
        lVar10 = 0;
        do {
          if (IVar6 <= lVar10) goto LAB_007b1b76;
          ChStreamOutAscii::operator<<(&file_b.super_ChStreamOutAscii,pdVar5[lVar10]);
          ChStreamOutAscii::operator<<(&file_b.super_ChStreamOutAscii,"\n");
          lVar10 = lVar10 + 1;
        } while (IVar6 != lVar10);
      }
      pcVar4 = (path->_M_dataplus)._M_p;
      __str_5._M_dataplus._M_p = (pointer)&__str_5.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__str_5,pcVar4,pcVar4 + path->_M_string_length);
      std::__cxx11::string::append((char *)&__str_5);
      puVar1 = &file_fric.super_ChStreamFile.field_0x10;
      plVar7 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&__str_5,(ulong)(prefix->_M_dataplus)._M_p);
      psVar9 = (size_type *)(plVar7 + 2);
      if ((size_type *)*plVar7 == psVar9) {
        __str_4.field_2._M_allocated_capacity = *psVar9;
        __str_4.field_2._8_8_ = plVar7[3];
        __str_4._M_dataplus._M_p = (pointer)&__str_4.field_2;
      }
      else {
        __str_4.field_2._M_allocated_capacity = *psVar9;
        __str_4._M_dataplus._M_p = (pointer)*plVar7;
      }
      __str_4._M_string_length = plVar7[1];
      *plVar7 = (long)psVar9;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&__str_4);
      pp_Var8 = (_func_int **)(plVar7 + 2);
      if ((_func_int **)*plVar7 == pp_Var8) {
        file_fric.super_ChStreamFile._16_8_ = *pp_Var8;
        file_fric.super_ChStreamFile._24_8_ = plVar7[3];
        file_fric.super_ChStreamFile._vptr_ChStreamFile = (_func_int **)puVar1;
      }
      else {
        file_fric.super_ChStreamFile._16_8_ = *pp_Var8;
        file_fric.super_ChStreamFile._vptr_ChStreamFile = (_func_int **)*plVar7;
      }
      file_fric.super_ChStreamFile._8_8_ = plVar7[1];
      *plVar7 = (long)pp_Var8;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      std::__cxx11::string::operator=((string *)&filename,(string *)&file_fric);
      if (file_fric.super_ChStreamFile._vptr_ChStreamFile != (_func_int **)puVar1) {
        operator_delete(file_fric.super_ChStreamFile._vptr_ChStreamFile,
                        file_fric.super_ChStreamFile._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str_4._M_dataplus._M_p != &__str_4.field_2) {
        operator_delete(__str_4._M_dataplus._M_p,__str_4.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str_5._M_dataplus._M_p != &__str_5.field_2) {
        operator_delete(__str_5._M_dataplus._M_p,__str_5.field_2._M_allocated_capacity + 1);
      }
      ChStreamOutAsciiFile::ChStreamOutAsciiFile(&file_fric,filename._M_dataplus._M_p,_S_trunc);
      IVar6 = mdfric.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
      ;
      pdVar5 = mdfric.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_data;
      builtin_strncpy(file_fric.super_ChStreamOutAscii.number_format,"%.12g",6);
      if (-1 < mdfric.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_rows ||
          mdfric.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data ==
          (double *)0x0) {
        if (0 < mdfric.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows) {
          lVar10 = 0;
          do {
            if (IVar6 <= lVar10) {
LAB_007b1b76:
              __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                            "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x77,
                            "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Ref<const Eigen::Matrix<double, -1, -1, 1>>, 0>::operator()(Index, Index) const [Derived = Eigen::Ref<const Eigen::Matrix<double, -1, -1, 1>>, Level = 0]"
                           );
            }
            ChStreamOutAscii::operator<<(&file_fric.super_ChStreamOutAscii,pdVar5[lVar10]);
            ChStreamOutAscii::operator<<(&file_fric.super_ChStreamOutAscii,"\n");
            lVar10 = lVar10 + 1;
          } while (IVar6 != lVar10);
        }
        ChStreamOutAsciiFile::~ChStreamOutAsciiFile(&file_fric);
        ChStreamOutAsciiFile::~ChStreamOutAsciiFile(&file_b);
        ChStreamOutAsciiFile::~ChStreamOutAsciiFile(&file_f);
        ChStreamOutAsciiFile::~ChStreamOutAsciiFile(&file_E);
        ChStreamOutAsciiFile::~ChStreamOutAsciiFile(&file_Cq);
        ChStreamOutAsciiFile::~ChStreamOutAsciiFile(&file_M);
        if (mdfric.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
            != (double *)0x0) {
          free((void *)mdfric.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                       m_storage.m_data[-1]);
        }
        if (mdb.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
            (double *)0x0) {
          free((void *)mdb.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                       m_data[-1]);
        }
        if (mdf.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
            (double *)0x0) {
          free((void *)mdf.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                       m_data[-1]);
        }
        mdE._vptr_SparseMatrix = (_func_int **)&PTR_SetElement_00b34038;
        free(mdE.m_outerIndex);
        free(mdE.m_innerNonZeros);
        Eigen::internal::CompressedStorage<double,_int>::~CompressedStorage(&mdE.m_data);
        mdCq._vptr_SparseMatrix = (_func_int **)&PTR_SetElement_00b34038;
        free(mdCq.m_outerIndex);
        free(mdCq.m_innerNonZeros);
        Eigen::internal::CompressedStorage<double,_int>::~CompressedStorage(&mdCq.m_data);
        mdM._vptr_SparseMatrix = (_func_int **)&PTR_SetElement_00b34038;
        free(mdM.m_outerIndex);
        free(mdM.m_innerNonZeros);
        Eigen::internal::CompressedStorage<double,_int>::~CompressedStorage(&mdM.m_data);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)filename._M_dataplus._M_p != &filename.field_2) {
          operator_delete(filename._M_dataplus._M_p,
                          CONCAT71(filename.field_2._M_allocated_capacity._1_7_,
                                   filename.field_2._M_local_buf[0]) + 1);
        }
        return;
      }
    }
  }
  __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,
                "Eigen::MapBase<Eigen::Ref<const Eigen::Matrix<double, -1, -1, 1>>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Ref<const Eigen::Matrix<double, -1, -1, 1>>, Level = 0]"
               );
}

Assistant:

void ChSystemDescriptor::WriteMatrixBlocks(const std::string& path, const std::string& prefix) {
    const char* numformat = "%.12g";
    std::string filename;

    ChSparseMatrix mdM;
    ChSparseMatrix mdCq;
    ChSparseMatrix mdE;
    ChVectorDynamic<double> mdf;
    ChVectorDynamic<double> mdb;
    ChVectorDynamic<double> mdfric;
    ConvertToMatrixForm(&mdCq, &mdM, &mdE, &mdf, &mdb, &mdfric);

    filename = path + "/" + prefix + "_M.dat";
    ChStreamOutAsciiFile file_M(filename.c_str());
    file_M.SetNumFormat(numformat);
    StreamOUTsparseMatlabFormat(mdM, file_M);

    filename = path + "/" + prefix + "_Cq.dat";
    ChStreamOutAsciiFile file_Cq(filename.c_str());
    file_Cq.SetNumFormat(numformat);
    StreamOUTsparseMatlabFormat(mdCq, file_Cq);

    filename = path + "/" + prefix + "_E.dat";
    ChStreamOutAsciiFile file_E(filename.c_str());
    file_E.SetNumFormat(numformat);
    StreamOUTsparseMatlabFormat(mdE, file_E);

    filename = path + "/" + prefix + "_f.dat";
    ChStreamOutAsciiFile file_f(filename.c_str());
    file_f.SetNumFormat(numformat);
    StreamOUTdenseMatlabFormat(mdf, file_f);

    filename = path + "/" + prefix + "_b.dat";
    ChStreamOutAsciiFile file_b(filename.c_str());
    file_b.SetNumFormat(numformat);
    StreamOUTdenseMatlabFormat(mdb, file_b);

    filename = path + "/" + prefix + "_fric.dat";
    ChStreamOutAsciiFile file_fric(filename.c_str());
    file_fric.SetNumFormat(numformat);
    StreamOUTdenseMatlabFormat(mdfric, file_fric);
}